

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcAbs.c
# Opt level: O2

int Wla_ManSolve(Wla_Man_t *pWla,Wlc_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  abctime aVar3;
  Wlc_Ntk_t *pAbs;
  Aig_Man_t *pAig;
  abctime aVar4;
  char *pcVar5;
  abctime time;
  uint uVar6;
  char *__format;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  aVar3 = Abc_Clock();
  uVar6 = 1;
  while (pWla->nIters = uVar6, iVar1 = -1, (int)uVar6 < pPars->nIterMax) {
    if (pPars->fVerbose != 0) {
      printf("\nIteration %d:\n",(ulong)uVar6);
    }
    pAbs = Wla_ManCreateAbs(pWla);
    pAig = Wla_ManBitBlast(pWla,pAbs);
    Wlc_NtkFree(pAbs);
    iVar1 = Wla_ManSolveInt(pWla,pAig);
    Aig_ManStop(pAig);
    if ((iVar1 != -1) ||
       ((pPars->pFuncStop != (_func_int_int *)0x0 &&
        (iVar2 = (*pPars->pFuncStop)(pPars->RunId), iVar1 = -1, iVar2 != 0)))) break;
    Wla_ManRefine(pWla);
    uVar6 = pWla->nIters + 1;
  }
  if (pPars->fVerbose != 0) {
    putchar(10);
  }
  printf("Abstraction ");
  pcVar5 = "timed out";
  if (iVar1 == 1) {
    pcVar5 = "is successfully proved";
  }
  __format = "resulted in a real CEX";
  if (iVar1 != 0) {
    __format = pcVar5;
  }
  printf(__format);
  printf(" after %d iterations. ",(ulong)(uint)pWla->nIters);
  aVar4 = Abc_Clock();
  pcVar5 = (char *)(aVar4 - aVar3);
  iVar2 = 0x816bba;
  Abc_PrintTime(0x816bba,pcVar5,time);
  if ((pPars->fVerbose != 0) &&
     (Abc_Print(iVar2,"PDRA reused %d clauses.\n",(ulong)(uint)pWla->nTotalCla),
     pPars->fVerbose != 0)) {
    Abc_Print(iVar2,"%s =","PDR          ");
    dVar7 = (double)(long)pcVar5;
    dVar8 = 0.0;
    if (aVar4 != aVar3) {
      dVar8 = ((double)pWla->tPdr * 100.0) / dVar7;
    }
    dVar10 = 0.0;
    if (aVar4 != aVar3) {
      dVar10 = (dVar7 * 100.0) / dVar7;
    }
    Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)pWla->tPdr / 1000000.0,dVar8);
    Abc_Print(iVar2,"%s =","CEX Refine   ");
    dVar8 = 0.0;
    if (aVar4 != aVar3) {
      dVar8 = ((double)pWla->tCbr * 100.0) / dVar7;
    }
    Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)pWla->tCbr / 1000000.0,dVar8);
    Abc_Print(iVar2,"%s =","Proof Refine ");
    dVar8 = 0.0;
    if (aVar4 != aVar3) {
      dVar8 = ((double)pWla->tPbr * 100.0) / dVar7;
    }
    Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",(double)pWla->tPbr / 1000000.0,dVar8);
    Abc_Print(iVar2,"%s =","Misc.        ");
    dVar9 = (double)((long)pcVar5 - (pWla->tPdr + pWla->tCbr + pWla->tPbr));
    dVar8 = 0.0;
    if (aVar4 != aVar3) {
      dVar8 = (dVar9 * 100.0) / dVar7;
    }
    Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",dVar9 / 1000000.0,dVar8);
    Abc_Print(iVar2,"%s =","Total        ");
    Abc_Print(iVar2,"%9.2f sec (%6.2f %%)\n",dVar7 / 1000000.0,dVar10);
  }
  return iVar1;
}

Assistant:

int Wla_ManSolve( Wla_Man_t * pWla, Wlc_Par_t * pPars )
{
    abctime clk = Abc_Clock();
    abctime tTotal;
    Wlc_Ntk_t * pAbs = NULL;
    Aig_Man_t * pAig = NULL;

    int RetValue = -1;

    // perform refinement iterations
    for ( pWla->nIters = 1; pWla->nIters < pPars->nIterMax; ++pWla->nIters )
    {
        if ( pPars->fVerbose )
            printf( "\nIteration %d:\n", pWla->nIters );

        pAbs = Wla_ManCreateAbs( pWla );

        pAig = Wla_ManBitBlast( pWla, pAbs );
        Wlc_NtkFree( pAbs );

        RetValue = Wla_ManSolveInt( pWla, pAig );
        Aig_ManStop( pAig );

        if ( RetValue != -1 || (pPars->pFuncStop && pPars->pFuncStop( pPars->RunId)) )
            break;

        Wla_ManRefine( pWla );
    }

    // report the result
    if ( pPars->fVerbose )
        printf( "\n" );
    printf( "Abstraction " );
    if ( RetValue == 0 )
        printf( "resulted in a real CEX" );
    else if ( RetValue == 1 )
        printf( "is successfully proved" );
    else 
        printf( "timed out" );
    printf( " after %d iterations. ", pWla->nIters );
    tTotal = Abc_Clock() - clk;
    Abc_PrintTime( 1, "Time", tTotal );

    if ( pPars->fVerbose )
        Abc_Print( 1, "PDRA reused %d clauses.\n", pWla->nTotalCla );
    if ( pPars->fVerbose )
    {
        ABC_PRTP( "PDR          ", pWla->tPdr,                          tTotal );
        ABC_PRTP( "CEX Refine   ", pWla->tCbr,                          tTotal );
        ABC_PRTP( "Proof Refine ", pWla->tPbr,                          tTotal );
        ABC_PRTP( "Misc.        ", tTotal - pWla->tPdr - pWla->tCbr - pWla->tPbr,   tTotal );
        ABC_PRTP( "Total        ", tTotal,                              tTotal );
    }

    return RetValue;
}